

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

iterator __thiscall
google::protobuf::RepeatedField<float>::erase
          (RepeatedField<float> *this,const_iterator first,const_iterator last)

{
  void *__dest;
  void *pvVar1;
  size_t __n;
  
  pvVar1 = this->arena_or_elements_;
  if (first != last) {
    __dest = (void *)((long)pvVar1 + (long)(int)((ulong)((long)first - (long)pvVar1) >> 2) * 4);
    __n = (long)pvVar1 + ((long)this->current_size_ * 4 - (long)last);
    if (__n != 0) {
      memmove(__dest,last,__n);
    }
    if (0 < this->current_size_) {
      this->current_size_ = (int)((long)__dest + (__n - (long)this->arena_or_elements_) >> 2);
    }
  }
  return (iterator)
         ((long)(int)((ulong)((long)first - (long)pvVar1) >> 2) * 4 + (long)this->arena_or_elements_
         );
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}